

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

void __thiscall duckdb::DuckTransaction::SetReadWrite(DuckTransaction *this)

{
  element_type *peVar1;
  element_type *in_RAX;
  pointer *__ptr;
  element_type *local_18;
  
  (this->super_Transaction).is_read_only = false;
  local_18 = in_RAX;
  StorageLock::GetSharedLock((StorageLock *)&local_18);
  peVar1 = local_18;
  local_18 = (element_type *)0x0;
  ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
        &this->write_lock,(pointer)peVar1);
  peVar1 = local_18;
  if (local_18 != (element_type *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_18);
    operator_delete(peVar1);
  }
  return;
}

Assistant:

void DuckTransaction::SetReadWrite() {
	Transaction::SetReadWrite();
	// obtain a shared checkpoint lock to prevent concurrent checkpoints while this transaction is running
	write_lock = transaction_manager.SharedCheckpointLock();
}